

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::post_process_single_component_masked::post_process_single_component_masked
          (post_process_single_component_masked *this,void *raw_data,size_t stride,
          size_t bytes_per_pixel,uint32_t bits_per_pixel)

{
  (this->super_process_line)._vptr_process_line = (_func_int **)&PTR__process_line_001403a0;
  this->raw_data_ = raw_data;
  this->bytes_per_pixel_ = bytes_per_pixel;
  this->stride_ = stride;
  this->mask_ = ~(-1 << ((byte)bits_per_pixel & 0x1f));
  this->single_byte_pixel_ = bytes_per_pixel == 1;
  if (bytes_per_pixel - 1 < 2) {
    return;
  }
  __assert_fail("bytes_per_pixel == sizeof(uint8_t) || bytes_per_pixel == sizeof(uint16_t)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/process_line.h"
                ,0x52,
                "charls::post_process_single_component_masked::post_process_single_component_masked(void *, const size_t, const size_t, const uint32_t)"
               );
}

Assistant:

post_process_single_component_masked(void* raw_data, const size_t stride, const size_t bytes_per_pixel,
                                         const uint32_t bits_per_pixel) noexcept :
        raw_data_{raw_data},
        bytes_per_pixel_{bytes_per_pixel},
        stride_{stride},
        mask_{(1U << bits_per_pixel) - 1U},
        single_byte_pixel_{bytes_per_pixel_ == sizeof(uint8_t)}
    {
        ASSERT(bytes_per_pixel == sizeof(uint8_t) || bytes_per_pixel == sizeof(uint16_t));
    }